

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_manual_options_widget_base.h
# Opt level: O0

void __thiscall
Ui_ManualOptionsWidgetBase::setupUi
          (Ui_ManualOptionsWidgetBase *this,QWidget *ManualOptionsWidgetBase)

{
  QWidget *pQVar1;
  bool bVar2;
  QGridLayout *pQVar3;
  QLabel *pQVar4;
  QSlider *pQVar5;
  QLineEdit *pQVar6;
  QSpacerItem *pQVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QFlags<Qt::AlignmentFlag> local_200;
  QFlags<Qt::AlignmentFlag> local_1fc;
  QSize local_1f8;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_1f0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_1ec;
  QByteArrayView local_1e8;
  QString local_1d8;
  QFlags<Qt::AlignmentFlag> local_1bc;
  QSize local_1b8;
  QByteArrayView local_1b0;
  QString local_1a0;
  QFlags<Qt::AlignmentFlag> local_184;
  QByteArrayView local_180;
  QString local_170;
  QFlags<Qt::WindowType> local_154;
  QFlags<Qt::AlignmentFlag> local_150;
  QSize local_14c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_144;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_140;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_13c;
  undefined1 auStack_138 [4];
  QSizePolicy sizePolicy1;
  QString local_128;
  QFlags<Qt::AlignmentFlag> local_10c;
  QSize local_108;
  QByteArrayView local_100;
  QString local_f0;
  QFlags<Qt::AlignmentFlag> local_d4;
  QByteArrayView local_d0;
  QString local_c0;
  QFlags<Qt::WindowType> local_a4;
  QByteArrayView local_a0;
  QString local_90;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_74;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_70;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_6c;
  undefined1 auStack_68 [4];
  QSizePolicy sizePolicy;
  QString local_58;
  QString local_30;
  QWidget *local_18;
  QWidget *ManualOptionsWidgetBase_local;
  Ui_ManualOptionsWidgetBase *this_local;
  
  local_18 = ManualOptionsWidgetBase;
  ManualOptionsWidgetBase_local = (QWidget *)this;
  QObject::objectName();
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar1 = local_18;
  if (bVar2) {
    QByteArrayView::QByteArrayView<24ul>
              ((QByteArrayView *)auStack_68,(char (*) [24])"ManualOptionsWidgetBase");
    QVar8.m_data = _auStack_68;
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar8);
    QObject::setObjectName((QString *)pQVar1);
    QString::~QString(&local_58);
  }
  QWidget::resize(local_18,0x188,0x4c);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_6c.bits,Preferred,Maximum,DefaultType);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)&local_6c.bits,0);
  QSizePolicy::setVerticalStretch((QSizePolicy *)&local_6c.bits,0);
  local_70.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_70.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_6c.bits,bVar2);
  local_74 = local_6c;
  QWidget::setSizePolicy((QSizePolicy *)local_18);
  pQVar3 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar3,local_18);
  this->gridLayout = pQVar3;
  pQVar3 = this->gridLayout;
  QByteArrayView::QByteArrayView<11ul>(&local_a0,(char (*) [11])"gridLayout");
  QVar9.m_data = (storage_type *)local_a0.m_size;
  QVar9.m_size = (qsizetype)&local_90;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_90);
  QLayout::setContentsMargins((int)this->gridLayout,4,4,4);
  pQVar4 = (QLabel *)operator_new(0x28);
  pQVar1 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_a4);
  QLabel::QLabel(pQVar4,pQVar1,(QFlags_conflict1 *)(ulong)local_a4.i);
  this->blackPointLabel = pQVar4;
  pQVar4 = this->blackPointLabel;
  QByteArrayView::QByteArrayView<16ul>(&local_d0,(char (*) [16])"blackPointLabel");
  QVar10.m_data = (storage_type *)local_d0.m_size;
  QVar10.m_size = (qsizetype)&local_c0;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_c0);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar4 = this->blackPointLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_d4);
  QGridLayout::addWidget(pQVar1,(int)pQVar4,0,0,1,(QFlags_conflict1 *)0x1);
  pQVar5 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar5,local_18);
  this->blackPointSlider = pQVar5;
  pQVar5 = this->blackPointSlider;
  QByteArrayView::QByteArrayView<17ul>(&local_100,(char (*) [17])"blackPointSlider");
  QVar11.m_data = (storage_type *)local_100.m_size;
  QVar11.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_f0);
  pQVar1 = (QWidget *)this->blackPointSlider;
  QSize::QSize(&local_108,200,0);
  QWidget::setMinimumSize(pQVar1,&local_108);
  QAbstractSlider::setOrientation((Orientation)this->blackPointSlider);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->blackPointSlider;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_10c);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,0,1,1,(QFlags_conflict1 *)0x1);
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,local_18);
  this->blackPointEdit = pQVar6;
  pQVar6 = this->blackPointEdit;
  QByteArrayView::QByteArrayView<15ul>
            ((QByteArrayView *)auStack_138,(char (*) [15])"blackPointEdit");
  QVar12.m_data = _auStack_138;
  QVar12.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_128);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_13c.bits,Preferred,Fixed,DefaultType);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)&local_13c.bits,0);
  QSizePolicy::setVerticalStretch((QSizePolicy *)&local_13c.bits,0);
  local_140.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_140.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_13c.bits,bVar2);
  local_144 = local_13c;
  QWidget::setSizePolicy((QSizePolicy *)this->blackPointEdit);
  pQVar1 = (QWidget *)this->blackPointEdit;
  QSize::QSize(&local_14c,100,0);
  QWidget::setMinimumSize(pQVar1,&local_14c);
  QLineEdit::setReadOnly(SUB81(this->blackPointEdit,0));
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar6 = this->blackPointEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_150);
  QGridLayout::addWidget(pQVar1,(int)pQVar6,0,2,1,(QFlags_conflict1 *)0x1);
  pQVar4 = (QLabel *)operator_new(0x28);
  pQVar1 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_154);
  QLabel::QLabel(pQVar4,pQVar1,(QFlags_conflict1 *)(ulong)local_154.i);
  this->whitePointLabel = pQVar4;
  pQVar4 = this->whitePointLabel;
  QByteArrayView::QByteArrayView<16ul>(&local_180,(char (*) [16])"whitePointLabel");
  QVar13.m_data = (storage_type *)local_180.m_size;
  QVar13.m_size = (qsizetype)&local_170;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_170);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar4 = this->whitePointLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_184);
  QGridLayout::addWidget(pQVar1,(int)pQVar4,1,0,1,(QFlags_conflict1 *)0x1);
  pQVar5 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar5,local_18);
  this->whitePointSlider = pQVar5;
  pQVar5 = this->whitePointSlider;
  QByteArrayView::QByteArrayView<17ul>(&local_1b0,(char (*) [17])"whitePointSlider");
  QVar14.m_data = (storage_type *)local_1b0.m_size;
  QVar14.m_size = (qsizetype)&local_1a0;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_1a0);
  pQVar1 = (QWidget *)this->whitePointSlider;
  QSize::QSize(&local_1b8,200,0);
  QWidget::setMinimumSize(pQVar1,&local_1b8);
  QAbstractSlider::setOrientation((Orientation)this->whitePointSlider);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->whitePointSlider;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1bc);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,1,1,1,(QFlags_conflict1 *)0x1);
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,local_18);
  this->whitePointEdit = pQVar6;
  pQVar6 = this->whitePointEdit;
  QByteArrayView::QByteArrayView<15ul>(&local_1e8,(char (*) [15])"whitePointEdit");
  QVar15.m_data = (storage_type *)local_1e8.m_size;
  QVar15.m_size = (qsizetype)&local_1d8;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_1d8);
  local_1ec.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_1ec.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_13c.bits,bVar2);
  local_1f0 = local_13c;
  QWidget::setSizePolicy((QSizePolicy *)this->whitePointEdit);
  pQVar1 = (QWidget *)this->whitePointEdit;
  QSize::QSize(&local_1f8,100,0);
  QWidget::setMinimumSize(pQVar1,&local_1f8);
  QLineEdit::setReadOnly(SUB81(this->whitePointEdit,0));
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar6 = this->whitePointEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1fc);
  QGridLayout::addWidget(pQVar1,(int)pQVar6,1,2,1,(QFlags_conflict1 *)0x1);
  pQVar7 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar7,0x13e,6,Minimum,Expanding);
  this->verticalSpacer = pQVar7;
  pQVar3 = this->gridLayout;
  pQVar7 = this->verticalSpacer;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_200);
  QGridLayout::addItem((QLayoutItem *)pQVar3,(int)pQVar7,2,0,1,(QFlags_conflict1 *)0x3);
  retranslateUi(this,local_18);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QWidget *ManualOptionsWidgetBase)
    {
        if (ManualOptionsWidgetBase->objectName().isEmpty())
            ManualOptionsWidgetBase->setObjectName(QString::fromUtf8("ManualOptionsWidgetBase"));
        ManualOptionsWidgetBase->resize(392, 76);
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Maximum);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(ManualOptionsWidgetBase->sizePolicy().hasHeightForWidth());
        ManualOptionsWidgetBase->setSizePolicy(sizePolicy);
        gridLayout = new QGridLayout(ManualOptionsWidgetBase);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        gridLayout->setContentsMargins(4, 4, 4, 4);
        blackPointLabel = new QLabel(ManualOptionsWidgetBase);
        blackPointLabel->setObjectName(QString::fromUtf8("blackPointLabel"));

        gridLayout->addWidget(blackPointLabel, 0, 0, 1, 1);

        blackPointSlider = new QSlider(ManualOptionsWidgetBase);
        blackPointSlider->setObjectName(QString::fromUtf8("blackPointSlider"));
        blackPointSlider->setMinimumSize(QSize(200, 0));
        blackPointSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(blackPointSlider, 0, 1, 1, 1);

        blackPointEdit = new QLineEdit(ManualOptionsWidgetBase);
        blackPointEdit->setObjectName(QString::fromUtf8("blackPointEdit"));
        QSizePolicy sizePolicy1(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(blackPointEdit->sizePolicy().hasHeightForWidth());
        blackPointEdit->setSizePolicy(sizePolicy1);
        blackPointEdit->setMinimumSize(QSize(100, 0));
        blackPointEdit->setReadOnly(true);

        gridLayout->addWidget(blackPointEdit, 0, 2, 1, 1);

        whitePointLabel = new QLabel(ManualOptionsWidgetBase);
        whitePointLabel->setObjectName(QString::fromUtf8("whitePointLabel"));

        gridLayout->addWidget(whitePointLabel, 1, 0, 1, 1);

        whitePointSlider = new QSlider(ManualOptionsWidgetBase);
        whitePointSlider->setObjectName(QString::fromUtf8("whitePointSlider"));
        whitePointSlider->setMinimumSize(QSize(200, 0));
        whitePointSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(whitePointSlider, 1, 1, 1, 1);

        whitePointEdit = new QLineEdit(ManualOptionsWidgetBase);
        whitePointEdit->setObjectName(QString::fromUtf8("whitePointEdit"));
        sizePolicy1.setHeightForWidth(whitePointEdit->sizePolicy().hasHeightForWidth());
        whitePointEdit->setSizePolicy(sizePolicy1);
        whitePointEdit->setMinimumSize(QSize(100, 0));
        whitePointEdit->setReadOnly(true);

        gridLayout->addWidget(whitePointEdit, 1, 2, 1, 1);

        verticalSpacer = new QSpacerItem(318, 6, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout->addItem(verticalSpacer, 2, 0, 1, 3);


        retranslateUi(ManualOptionsWidgetBase);

        QMetaObject::connectSlotsByName(ManualOptionsWidgetBase);
    }